

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcLits.c
# Opt level: O0

Mvc_Cover_t * Mvc_CoverBestLiteralCover(Mvc_Cover_t *pCover,Mvc_Cover_t *pSimple)

{
  int iVar1;
  Mvc_Cover_t *pCover_00;
  Mvc_Cube_t *pMVar2;
  Mvc_Cube_t *pMask;
  Mvc_List_t *pList;
  int _i_;
  int iLitBest;
  Mvc_Cube_t *pCubeS;
  Mvc_Cube_t *pCubeNew;
  Mvc_Cover_t *pCoverNew;
  Mvc_Cover_t *pSimple_local;
  Mvc_Cover_t *pCover_local;
  
  pCover_00 = Mvc_CoverClone(pCover);
  pMVar2 = Mvc_CubeAlloc(pCover_00);
  if ((*(uint *)&pMVar2->field_0x8 & 0xffffff) == 0) {
    pMVar2->pData[0] = 0;
  }
  else if ((*(uint *)&pMVar2->field_0x8 & 0xffffff) == 1) {
    pMVar2->pData[0] = 0;
    *(undefined4 *)&pMVar2->field_0x14 = 0;
  }
  else {
    for (pList._0_4_ = *(uint *)&pMVar2->field_0x8 & 0xffffff; -1 < (int)(uint)pList;
        pList._0_4_ = (uint)pList - 1) {
      pMVar2->pData[(int)(uint)pList] = 0;
    }
  }
  iVar1 = Mvc_CoverReadCubeNum(pSimple);
  if (iVar1 != 1) {
    __assert_fail("Mvc_CoverReadCubeNum(pSimple) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/mvc/mvcLits.c"
                  ,0xee,"Mvc_Cover_t *Mvc_CoverBestLiteralCover(Mvc_Cover_t *, Mvc_Cover_t *)");
  }
  pMask = Mvc_CoverReadCubeHead(pSimple);
  iVar1 = Mvc_CoverBestLiteral(pCover,pMask);
  pMVar2->pData[iVar1 >> 5] = 1 << ((byte)iVar1 & 0x1f) | pMVar2->pData[iVar1 >> 5];
  if ((pCover_00->lCubes).pHead == (Mvc_Cube_t *)0x0) {
    (pCover_00->lCubes).pHead = pMVar2;
  }
  else {
    ((pCover_00->lCubes).pTail)->pNext = pMVar2;
  }
  (pCover_00->lCubes).pTail = pMVar2;
  pMVar2->pNext = (Mvc_Cube_t *)0x0;
  (pCover_00->lCubes).nItems = (pCover_00->lCubes).nItems + 1;
  return pCover_00;
}

Assistant:

Mvc_Cover_t * Mvc_CoverBestLiteralCover( Mvc_Cover_t * pCover, Mvc_Cover_t * pSimple )
{
    Mvc_Cover_t * pCoverNew;
    Mvc_Cube_t * pCubeNew;
    Mvc_Cube_t * pCubeS;
    int iLitBest;

    // create the new cover
    pCoverNew = Mvc_CoverClone( pCover );
    // get the new cube
    pCubeNew = Mvc_CubeAlloc( pCoverNew );
    // clean the cube
    Mvc_CubeBitClean( pCubeNew );

    // get the first cube of pSimple
    assert( Mvc_CoverReadCubeNum(pSimple) == 1 );
    pCubeS = Mvc_CoverReadCubeHead( pSimple );
    // find the best literal among those of pCubeS
    iLitBest = Mvc_CoverBestLiteral( pCover, pCubeS );

    // insert this literal into the cube
    Mvc_CubeBitInsert( pCubeNew, iLitBest );
    // add the cube to the cover
    Mvc_CoverAddCubeTail( pCoverNew, pCubeNew );
    return pCoverNew;
}